

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::internal::AddDescriptors(DescriptorTable *table)

{
  ulong uVar1;
  ulong uVar2;
  
  if (table->is_initialized != false) {
    return;
  }
  table->is_initialized = true;
  InitProtobufDefaults();
  uVar2 = 0;
  uVar1 = (ulong)(uint)table->num_deps;
  if (table->num_deps < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    if (table->deps[uVar2] != (DescriptorTable *)0x0) {
      AddDescriptors(table->deps[uVar2]);
    }
  }
  DescriptorPool::InternalAddGeneratedFile(table->descriptor,table->size);
  MessageFactory::InternalRegisterGeneratedFile(table);
  return;
}

Assistant:

void AddDescriptors(const DescriptorTable* table) {
  // AddDescriptors is not thread safe. Callers need to ensure calls are
  // properly serialized. This function is only called pre-main by global
  // descriptors and we can assume single threaded access or it's called
  // by AssignDescriptorImpl which uses a mutex to sequence calls.
  if (table->is_initialized) return;
  table->is_initialized = true;
  AddDescriptorsImpl(table);
}